

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void fdct16x32_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  undefined1 auVar1 [16];
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in1_07;
  __m256i in1_08;
  __m256i in1_09;
  __m256i in1_10;
  __m256i in1_11;
  __m256i in1_12;
  __m256i in1_13;
  __m256i in1_14;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  __m256i in0_02;
  __m256i in0_03;
  __m256i in0_04;
  __m256i in0_05;
  __m256i in0_06;
  __m256i in0_07;
  __m256i in0_08;
  __m256i in0_09;
  __m256i in0_10;
  __m256i in0_11;
  __m256i in0_12;
  __m256i in0_13;
  __m256i in0_14;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  __m256i _r_04;
  __m256i _r_05;
  __m256i _r_06;
  __m256i _r_07;
  __m256i _r_08;
  __m256i _r_09;
  __m256i _r_10;
  __m256i _r_11;
  __m256i _r_12;
  __m256i _r_13;
  __m256i _r_14;
  __m256i _r_15;
  __m256i _r_16;
  __m256i _r_17;
  __m256i _r_18;
  __m256i _r_19;
  __m256i _r_20;
  __m256i _r_21;
  __m256i _r_22;
  __m256i _r_23;
  __m256i _r_24;
  __m256i _r_25;
  __m256i _r_26;
  __m256i _r_27;
  __m256i _r_28;
  __m256i _r_29;
  __m256i _r_30;
  __m256i _r_31;
  __m256i _r_32;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w1_03;
  __m256i w1_04;
  __m256i w1_05;
  __m256i w1_06;
  __m256i w1_07;
  __m256i w1_08;
  __m256i w1_09;
  __m256i w1_10;
  __m256i w1_11;
  __m256i w1_12;
  __m256i w1_13;
  __m256i w1_14;
  __m256i w1_15;
  __m256i w1_16;
  __m256i w1_17;
  __m256i w1_18;
  __m256i w1_19;
  __m256i w1_20;
  __m256i w1_21;
  __m256i w1_22;
  __m256i w1_23;
  __m256i w1_24;
  __m256i w1_25;
  __m256i w1_26;
  __m256i w1_27;
  __m256i w1_28;
  __m256i w1_29;
  __m256i w1_30;
  __m256i w1_31;
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w0_02;
  __m256i w0_03;
  __m256i w0_04;
  __m256i w0_05;
  __m256i w0_06;
  __m256i w0_07;
  __m256i w0_08;
  __m256i w0_09;
  __m256i w0_10;
  __m256i w0_11;
  __m256i w0_12;
  __m256i w0_13;
  __m256i w0_14;
  __m256i w0_15;
  __m256i w0_16;
  __m256i w0_17;
  __m256i w0_18;
  __m256i w0_19;
  __m256i w0_20;
  __m256i w0_21;
  __m256i w0_22;
  __m256i w0_23;
  __m256i w0_24;
  __m256i w0_25;
  __m256i w0_26;
  __m256i w0_27;
  __m256i w0_28;
  __m256i w0_29;
  __m256i w0_30;
  __m256i w0_31;
  uint uVar2;
  char in_DL;
  undefined8 *in_RSI;
  __m256i x1 [32];
  __m256i cospi_m58_p06;
  __m256i cospi_p06_p58;
  __m256i cospi_m26_p38;
  __m256i cospi_p38_p26;
  __m256i cospi_m42_p22;
  __m256i cospi_p22_p42;
  __m256i cospi_m10_p54;
  __m256i cospi_p54_p10;
  __m256i cospi_m50_p14;
  __m256i cospi_p14_p50;
  __m256i cospi_m18_p46;
  __m256i cospi_p46_p18;
  __m256i cospi_m34_p30;
  __m256i cospi_p30_p34;
  __m256i cospi_m02_p62;
  __m256i cospi_p62_p02;
  __m256i cospi_m52_p12;
  __m256i cospi_p12_p52;
  __m256i cospi_m20_p44;
  __m256i cospi_p44_p20;
  __m256i cospi_m36_p28;
  __m256i cospi_p28_p36;
  __m256i cospi_m04_p60;
  __m256i cospi_p60_p04;
  __m256i cospi_m24_m40;
  __m256i cospi_m56_m08;
  __m256i cospi_m40_p24;
  __m256i cospi_p24_p40;
  __m256i cospi_m08_p56;
  __m256i cospi_p56_p08;
  __m256i cospi_p32_m32;
  __m256i cospi_m48_m16;
  __m256i cospi_p48_p16;
  __m256i cospi_m16_p48;
  __m256i cospi_p32_p32;
  __m256i cospi_m32_p32;
  __m256i _r;
  int32_t *cospi;
  undefined8 local_960;
  undefined8 uStackY_958;
  int16_t in_stack_fffffffffffff6b0;
  int16_t in_stack_fffffffffffff6b2;
  undefined4 uStack_94c;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 in_stack_fffffffffffff6d8;
  undefined8 in_stack_fffffffffffff6e0;
  __m256i *in_stack_fffffffffffff6e8;
  __m256i *in_stack_fffffffffffff6f0;
  undefined8 in_stack_fffffffffffff6f8;
  undefined8 in_stack_fffffffffffff700;
  undefined8 in_stack_fffffffffffff708;
  longlong in_stack_fffffffffffff710;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  __m256i *in_stack_fffffffffffff728;
  __m256i *in_stack_fffffffffffff730;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined4 uStack_790;
  int32_t in_stack_fffffffffffff874;
  undefined8 in_stack_fffffffffffff878;
  undefined8 in_stack_fffffffffffff880;
  undefined8 in_stack_fffffffffffff888;
  longlong in_stack_fffffffffffff890;
  undefined8 uStack_768;
  undefined8 local_760;
  __m256i *in_stack_fffffffffffff8a8;
  __m256i *in_stack_fffffffffffff8b0;
  undefined8 in_stack_fffffffffffff8b8;
  undefined8 in_stack_fffffffffffff8c0;
  undefined8 in_stack_fffffffffffff8c8;
  longlong in_stack_fffffffffffff8d0;
  undefined8 in_stack_fffffffffffff8d8;
  undefined8 in_stack_fffffffffffff8e0;
  undefined8 in_stack_fffffffffffff8e8;
  longlong in_stack_fffffffffffff8f0;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  
  cospi_arr((int)in_DL);
  uVar2 = 1 << (in_DL - 1U & 0x1f);
  auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
  auVar1 = vpinsrd_avx(auVar1,uVar2,2);
  vpinsrd_avx(auVar1,uVar2,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
  auVar1 = vpinsrd_avx(auVar1,uVar2,2);
  vpinsrd_avx(auVar1,uVar2,3);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  pair_set_w16_epi16(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0);
  in0[1] = in_stack_fffffffffffff700;
  in0[0] = in_stack_fffffffffffff6f8;
  in0[2] = in_stack_fffffffffffff708;
  in0[3] = in_stack_fffffffffffff710;
  in1[1] = in_stack_fffffffffffff6e0;
  in1[0] = in_stack_fffffffffffff6d8;
  in1[2] = (longlong)in_stack_fffffffffffff6e8;
  in1[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0,in1);
  in0_00[1] = in_stack_fffffffffffff700;
  in0_00[0] = in_stack_fffffffffffff6f8;
  in0_00[2] = in_stack_fffffffffffff708;
  in0_00[3] = in_stack_fffffffffffff710;
  in1_00[1] = in_stack_fffffffffffff6e0;
  in1_00[0] = in_stack_fffffffffffff6d8;
  in1_00[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_00[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_00,in1_00);
  in0_01[1] = in_stack_fffffffffffff700;
  in0_01[0] = in_stack_fffffffffffff6f8;
  in0_01[2] = in_stack_fffffffffffff708;
  in0_01[3] = in_stack_fffffffffffff710;
  in1_01[1] = in_stack_fffffffffffff6e0;
  in1_01[0] = in_stack_fffffffffffff6d8;
  in1_01[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_01[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_01,in1_01);
  in0_02[1] = in_stack_fffffffffffff700;
  in0_02[0] = in_stack_fffffffffffff6f8;
  in0_02[2] = in_stack_fffffffffffff708;
  in0_02[3] = in_stack_fffffffffffff710;
  in1_02[1] = in_stack_fffffffffffff6e0;
  in1_02[0] = in_stack_fffffffffffff6d8;
  in1_02[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_02[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_02,in1_02);
  in0_03[1] = in_stack_fffffffffffff700;
  in0_03[0] = in_stack_fffffffffffff6f8;
  in0_03[2] = in_stack_fffffffffffff708;
  in0_03[3] = in_stack_fffffffffffff710;
  in1_03[1] = in_stack_fffffffffffff6e0;
  in1_03[0] = in_stack_fffffffffffff6d8;
  in1_03[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_03[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_03,in1_03);
  in0_04[1] = in_stack_fffffffffffff700;
  in0_04[0] = in_stack_fffffffffffff6f8;
  in0_04[2] = in_stack_fffffffffffff708;
  in0_04[3] = in_stack_fffffffffffff710;
  in1_04[1] = in_stack_fffffffffffff6e0;
  in1_04[0] = in_stack_fffffffffffff6d8;
  in1_04[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_04[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_04,in1_04);
  in0_05[1] = in_stack_fffffffffffff700;
  in0_05[0] = in_stack_fffffffffffff6f8;
  in0_05[2] = in_stack_fffffffffffff708;
  in0_05[3] = in_stack_fffffffffffff710;
  in1_05[1] = in_stack_fffffffffffff6e0;
  in1_05[0] = in_stack_fffffffffffff6d8;
  in1_05[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_05[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_05,in1_05);
  in0_06[1] = in_stack_fffffffffffff700;
  in0_06[0] = in_stack_fffffffffffff6f8;
  in0_06[2] = in_stack_fffffffffffff708;
  in0_06[3] = in_stack_fffffffffffff710;
  in1_06[1] = in_stack_fffffffffffff6e0;
  in1_06[0] = in_stack_fffffffffffff6d8;
  in1_06[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_06[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_06,in1_06);
  in0_07[1] = in_stack_fffffffffffff700;
  in0_07[0] = in_stack_fffffffffffff6f8;
  in0_07[2] = in_stack_fffffffffffff708;
  in0_07[3] = in_stack_fffffffffffff710;
  in1_07[1] = in_stack_fffffffffffff6e0;
  in1_07[0] = in_stack_fffffffffffff6d8;
  in1_07[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_07[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_07,in1_07);
  in0_08[1] = in_stack_fffffffffffff700;
  in0_08[0] = in_stack_fffffffffffff6f8;
  in0_08[2] = in_stack_fffffffffffff708;
  in0_08[3] = in_stack_fffffffffffff710;
  in1_08[1] = in_stack_fffffffffffff6e0;
  in1_08[0] = in_stack_fffffffffffff6d8;
  in1_08[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_08[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_08,in1_08);
  in0_09[1] = in_stack_fffffffffffff700;
  in0_09[0] = in_stack_fffffffffffff6f8;
  in0_09[2] = in_stack_fffffffffffff708;
  in0_09[3] = in_stack_fffffffffffff710;
  in1_09[1] = in_stack_fffffffffffff6e0;
  in1_09[0] = in_stack_fffffffffffff6d8;
  in1_09[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_09[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_09,in1_09);
  in0_10[1] = in_stack_fffffffffffff700;
  in0_10[0] = in_stack_fffffffffffff6f8;
  in0_10[2] = in_stack_fffffffffffff708;
  in0_10[3] = in_stack_fffffffffffff710;
  in1_10[1] = in_stack_fffffffffffff6e0;
  in1_10[0] = in_stack_fffffffffffff6d8;
  in1_10[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_10[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_10,in1_10);
  in0_11[1] = in_stack_fffffffffffff700;
  in0_11[0] = in_stack_fffffffffffff6f8;
  in0_11[2] = in_stack_fffffffffffff708;
  in0_11[3] = in_stack_fffffffffffff710;
  in1_11[1] = in_stack_fffffffffffff6e0;
  in1_11[0] = in_stack_fffffffffffff6d8;
  in1_11[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_11[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_11,in1_11);
  in0_12[1] = in_stack_fffffffffffff700;
  in0_12[0] = in_stack_fffffffffffff6f8;
  in0_12[2] = in_stack_fffffffffffff708;
  in0_12[3] = in_stack_fffffffffffff710;
  in1_12[1] = in_stack_fffffffffffff6e0;
  in1_12[0] = in_stack_fffffffffffff6d8;
  in1_12[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_12[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_12,in1_12);
  in0_13[1] = in_stack_fffffffffffff700;
  in0_13[0] = in_stack_fffffffffffff6f8;
  in0_13[2] = in_stack_fffffffffffff708;
  in0_13[3] = in_stack_fffffffffffff710;
  in1_13[1] = in_stack_fffffffffffff6e0;
  in1_13[0] = in_stack_fffffffffffff6d8;
  in1_13[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_13[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_13,in1_13);
  in0_14[1] = in_stack_fffffffffffff700;
  in0_14[0] = in_stack_fffffffffffff6f8;
  in0_14[2] = in_stack_fffffffffffff708;
  in0_14[3] = in_stack_fffffffffffff710;
  in1_14[1] = in_stack_fffffffffffff6e0;
  in1_14[0] = in_stack_fffffffffffff6d8;
  in1_14[2] = (longlong)in_stack_fffffffffffff6e8;
  in1_14[3] = (longlong)in_stack_fffffffffffff6f0;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffff730,in_stack_fffffffffffff728,in0_14,in1_14);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  w0[1] = in_stack_fffffffffffff8e0;
  w0[0] = in_stack_fffffffffffff8d8;
  w0[2] = in_stack_fffffffffffff8e8;
  w0[3] = in_stack_fffffffffffff8f0;
  w1[1] = in_stack_fffffffffffff8c0;
  w1[0] = in_stack_fffffffffffff8b8;
  w1[2] = in_stack_fffffffffffff8c8;
  w1[3] = in_stack_fffffffffffff8d0;
  _r_00[1] = in_stack_fffffffffffff880;
  _r_00[0] = in_stack_fffffffffffff878;
  _r_00[2] = in_stack_fffffffffffff888;
  _r_00[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0,w1,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_00,
                  in_stack_fffffffffffff874);
  w0_00[1] = in_stack_fffffffffffff8e0;
  w0_00[0] = in_stack_fffffffffffff8d8;
  w0_00[2] = in_stack_fffffffffffff8e8;
  w0_00[3] = in_stack_fffffffffffff8f0;
  w1_00[1] = in_stack_fffffffffffff8c0;
  w1_00[0] = in_stack_fffffffffffff8b8;
  w1_00[2] = in_stack_fffffffffffff8c8;
  w1_00[3] = in_stack_fffffffffffff8d0;
  _r_01[1] = in_stack_fffffffffffff880;
  _r_01[0] = in_stack_fffffffffffff878;
  _r_01[2] = in_stack_fffffffffffff888;
  _r_01[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_00,w1_00,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_01,
                  in_stack_fffffffffffff874);
  w0_01[1] = in_stack_fffffffffffff8e0;
  w0_01[0] = in_stack_fffffffffffff8d8;
  w0_01[2] = in_stack_fffffffffffff8e8;
  w0_01[3] = in_stack_fffffffffffff8f0;
  w1_01[1] = in_stack_fffffffffffff8c0;
  w1_01[0] = in_stack_fffffffffffff8b8;
  w1_01[2] = in_stack_fffffffffffff8c8;
  w1_01[3] = in_stack_fffffffffffff8d0;
  _r_02[1] = in_stack_fffffffffffff880;
  _r_02[0] = in_stack_fffffffffffff878;
  _r_02[2] = in_stack_fffffffffffff888;
  _r_02[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_01,w1_01,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_02,
                  in_stack_fffffffffffff874);
  w0_02[1] = in_stack_fffffffffffff8e0;
  w0_02[0] = in_stack_fffffffffffff8d8;
  w0_02[2] = in_stack_fffffffffffff8e8;
  w0_02[3] = in_stack_fffffffffffff8f0;
  w1_02[1] = in_stack_fffffffffffff8c0;
  w1_02[0] = in_stack_fffffffffffff8b8;
  w1_02[2] = in_stack_fffffffffffff8c8;
  w1_02[3] = in_stack_fffffffffffff8d0;
  _r_03[1] = in_stack_fffffffffffff880;
  _r_03[0] = in_stack_fffffffffffff878;
  _r_03[2] = in_stack_fffffffffffff888;
  _r_03[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_02,w1_02,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_03,
                  in_stack_fffffffffffff874);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  w0_03[1] = in_stack_fffffffffffff8e0;
  w0_03[0] = in_stack_fffffffffffff8d8;
  w0_03[2] = in_stack_fffffffffffff8e8;
  w0_03[3] = in_stack_fffffffffffff8f0;
  w1_03[1] = in_stack_fffffffffffff8c0;
  w1_03[0] = in_stack_fffffffffffff8b8;
  w1_03[2] = in_stack_fffffffffffff8c8;
  w1_03[3] = in_stack_fffffffffffff8d0;
  _r_04[1] = in_stack_fffffffffffff880;
  _r_04[0] = in_stack_fffffffffffff878;
  _r_04[2] = in_stack_fffffffffffff888;
  _r_04[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_03,w1_03,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_04,
                  in_stack_fffffffffffff874);
  w0_04[1] = in_stack_fffffffffffff8e0;
  w0_04[0] = in_stack_fffffffffffff8d8;
  w0_04[2] = in_stack_fffffffffffff8e8;
  w0_04[3] = in_stack_fffffffffffff8f0;
  w1_04[1] = in_stack_fffffffffffff8c0;
  w1_04[0] = in_stack_fffffffffffff8b8;
  w1_04[2] = in_stack_fffffffffffff8c8;
  w1_04[3] = in_stack_fffffffffffff8d0;
  _r_05[1] = in_stack_fffffffffffff880;
  _r_05[0] = in_stack_fffffffffffff878;
  _r_05[2] = in_stack_fffffffffffff888;
  _r_05[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_04,w1_04,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_05,
                  in_stack_fffffffffffff874);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  w0_05[1] = in_stack_fffffffffffff8e0;
  w0_05[0] = in_stack_fffffffffffff8d8;
  w0_05[2] = in_stack_fffffffffffff8e8;
  w0_05[3] = in_stack_fffffffffffff8f0;
  w1_05[1] = in_stack_fffffffffffff8c0;
  w1_05[0] = in_stack_fffffffffffff8b8;
  w1_05[2] = in_stack_fffffffffffff8c8;
  w1_05[3] = in_stack_fffffffffffff8d0;
  _r_06[1] = in_stack_fffffffffffff880;
  _r_06[0] = in_stack_fffffffffffff878;
  _r_06[2] = in_stack_fffffffffffff888;
  _r_06[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_05,w1_05,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_06,
                  in_stack_fffffffffffff874);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  w0_06[1] = in_stack_fffffffffffff8e0;
  w0_06[0] = in_stack_fffffffffffff8d8;
  w0_06[2] = in_stack_fffffffffffff8e8;
  w0_06[3] = in_stack_fffffffffffff8f0;
  w1_06[1] = in_stack_fffffffffffff8c0;
  w1_06[0] = in_stack_fffffffffffff8b8;
  w1_06[2] = in_stack_fffffffffffff8c8;
  w1_06[3] = in_stack_fffffffffffff8d0;
  _r_07[1] = in_stack_fffffffffffff880;
  _r_07[0] = in_stack_fffffffffffff878;
  _r_07[2] = in_stack_fffffffffffff888;
  _r_07[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_06,w1_06,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_07,
                  in_stack_fffffffffffff874);
  w0_07[1] = in_stack_fffffffffffff8e0;
  w0_07[0] = in_stack_fffffffffffff8d8;
  w0_07[2] = in_stack_fffffffffffff8e8;
  w0_07[3] = in_stack_fffffffffffff8f0;
  w1_07[1] = in_stack_fffffffffffff8c0;
  w1_07[0] = in_stack_fffffffffffff8b8;
  w1_07[2] = in_stack_fffffffffffff8c8;
  w1_07[3] = in_stack_fffffffffffff8d0;
  _r_08[1] = in_stack_fffffffffffff880;
  _r_08[0] = in_stack_fffffffffffff878;
  _r_08[2] = in_stack_fffffffffffff888;
  _r_08[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_07,w1_07,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_08,
                  in_stack_fffffffffffff874);
  w0_08[1] = in_stack_fffffffffffff8e0;
  w0_08[0] = in_stack_fffffffffffff8d8;
  w0_08[2] = in_stack_fffffffffffff8e8;
  w0_08[3] = in_stack_fffffffffffff8f0;
  w1_08[1] = in_stack_fffffffffffff8c0;
  w1_08[0] = in_stack_fffffffffffff8b8;
  w1_08[2] = in_stack_fffffffffffff8c8;
  w1_08[3] = in_stack_fffffffffffff8d0;
  _r_09[1] = in_stack_fffffffffffff880;
  _r_09[0] = in_stack_fffffffffffff878;
  _r_09[2] = in_stack_fffffffffffff888;
  _r_09[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_08,w1_08,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_09,
                  in_stack_fffffffffffff874);
  w0_09[1] = in_stack_fffffffffffff8e0;
  w0_09[0] = in_stack_fffffffffffff8d8;
  w0_09[2] = in_stack_fffffffffffff8e8;
  w0_09[3] = in_stack_fffffffffffff8f0;
  w1_09[1] = in_stack_fffffffffffff8c0;
  w1_09[0] = in_stack_fffffffffffff8b8;
  w1_09[2] = in_stack_fffffffffffff8c8;
  w1_09[3] = in_stack_fffffffffffff8d0;
  _r_10[1] = in_stack_fffffffffffff880;
  _r_10[0] = in_stack_fffffffffffff878;
  _r_10[2] = in_stack_fffffffffffff888;
  _r_10[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_09,w1_09,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_10,
                  in_stack_fffffffffffff874);
  w0_10[1] = in_stack_fffffffffffff8e0;
  w0_10[0] = in_stack_fffffffffffff8d8;
  w0_10[2] = in_stack_fffffffffffff8e8;
  w0_10[3] = in_stack_fffffffffffff8f0;
  w1_10[1] = in_stack_fffffffffffff8c0;
  w1_10[0] = in_stack_fffffffffffff8b8;
  w1_10[2] = in_stack_fffffffffffff8c8;
  w1_10[3] = in_stack_fffffffffffff8d0;
  _r_11[1] = in_stack_fffffffffffff880;
  _r_11[0] = in_stack_fffffffffffff878;
  _r_11[2] = in_stack_fffffffffffff888;
  _r_11[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_10,w1_10,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_11,
                  in_stack_fffffffffffff874);
  w0_11[1] = in_stack_fffffffffffff8e0;
  w0_11[0] = in_stack_fffffffffffff8d8;
  w0_11[2] = in_stack_fffffffffffff8e8;
  w0_11[3] = in_stack_fffffffffffff8f0;
  w1_11[1] = in_stack_fffffffffffff8c0;
  w1_11[0] = in_stack_fffffffffffff8b8;
  w1_11[2] = in_stack_fffffffffffff8c8;
  w1_11[3] = in_stack_fffffffffffff8d0;
  _r_12[1] = in_stack_fffffffffffff880;
  _r_12[0] = in_stack_fffffffffffff878;
  _r_12[2] = in_stack_fffffffffffff888;
  _r_12[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_11,w1_11,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_12,
                  in_stack_fffffffffffff874);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  w0_12[1] = in_stack_fffffffffffff8e0;
  w0_12[0] = in_stack_fffffffffffff8d8;
  w0_12[2] = in_stack_fffffffffffff8e8;
  w0_12[3] = in_stack_fffffffffffff8f0;
  w1_12[1] = in_stack_fffffffffffff8c0;
  w1_12[0] = in_stack_fffffffffffff8b8;
  w1_12[2] = in_stack_fffffffffffff8c8;
  w1_12[3] = in_stack_fffffffffffff8d0;
  _r_13[1] = in_stack_fffffffffffff880;
  _r_13[0] = in_stack_fffffffffffff878;
  _r_13[2] = in_stack_fffffffffffff888;
  _r_13[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_12,w1_12,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_13,
                  in_stack_fffffffffffff874);
  w0_13[1] = in_stack_fffffffffffff8e0;
  w0_13[0] = in_stack_fffffffffffff8d8;
  w0_13[2] = in_stack_fffffffffffff8e8;
  w0_13[3] = in_stack_fffffffffffff8f0;
  w1_13[1] = in_stack_fffffffffffff8c0;
  w1_13[0] = in_stack_fffffffffffff8b8;
  w1_13[2] = in_stack_fffffffffffff8c8;
  w1_13[3] = in_stack_fffffffffffff8d0;
  _r_14[1] = in_stack_fffffffffffff880;
  _r_14[0] = in_stack_fffffffffffff878;
  _r_14[2] = in_stack_fffffffffffff888;
  _r_14[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_13,w1_13,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_14,
                  in_stack_fffffffffffff874);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  w0_14[1] = in_stack_fffffffffffff8e0;
  w0_14[0] = in_stack_fffffffffffff8d8;
  w0_14[2] = in_stack_fffffffffffff8e8;
  w0_14[3] = in_stack_fffffffffffff8f0;
  w1_14[1] = in_stack_fffffffffffff8c0;
  w1_14[0] = in_stack_fffffffffffff8b8;
  w1_14[2] = in_stack_fffffffffffff8c8;
  w1_14[3] = in_stack_fffffffffffff8d0;
  _r_15[1] = in_stack_fffffffffffff880;
  _r_15[0] = in_stack_fffffffffffff878;
  _r_15[2] = in_stack_fffffffffffff888;
  _r_15[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_14,w1_14,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_15,
                  in_stack_fffffffffffff874);
  w0_15[1] = in_stack_fffffffffffff8e0;
  w0_15[0] = in_stack_fffffffffffff8d8;
  w0_15[2] = in_stack_fffffffffffff8e8;
  w0_15[3] = in_stack_fffffffffffff8f0;
  w1_15[1] = in_stack_fffffffffffff8c0;
  w1_15[0] = in_stack_fffffffffffff8b8;
  w1_15[2] = in_stack_fffffffffffff8c8;
  w1_15[3] = in_stack_fffffffffffff8d0;
  _r_16[1] = in_stack_fffffffffffff880;
  _r_16[0] = in_stack_fffffffffffff878;
  _r_16[2] = in_stack_fffffffffffff888;
  _r_16[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_15,w1_15,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_16,
                  in_stack_fffffffffffff874);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  w0_16[1] = in_stack_fffffffffffff8e0;
  w0_16[0] = in_stack_fffffffffffff8d8;
  w0_16[2] = in_stack_fffffffffffff8e8;
  w0_16[3] = in_stack_fffffffffffff8f0;
  w1_16[1] = in_stack_fffffffffffff8c0;
  w1_16[0] = in_stack_fffffffffffff8b8;
  w1_16[2] = in_stack_fffffffffffff8c8;
  w1_16[3] = in_stack_fffffffffffff8d0;
  _r_17[1] = in_stack_fffffffffffff880;
  _r_17[0] = in_stack_fffffffffffff878;
  _r_17[2] = in_stack_fffffffffffff888;
  _r_17[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_16,w1_16,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_17,
                  in_stack_fffffffffffff874);
  w0_17[1] = in_stack_fffffffffffff8e0;
  w0_17[0] = in_stack_fffffffffffff8d8;
  w0_17[2] = in_stack_fffffffffffff8e8;
  w0_17[3] = in_stack_fffffffffffff8f0;
  w1_17[1] = in_stack_fffffffffffff8c0;
  w1_17[0] = in_stack_fffffffffffff8b8;
  w1_17[2] = in_stack_fffffffffffff8c8;
  w1_17[3] = in_stack_fffffffffffff8d0;
  _r_18[1] = in_stack_fffffffffffff880;
  _r_18[0] = in_stack_fffffffffffff878;
  _r_18[2] = in_stack_fffffffffffff888;
  _r_18[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_17,w1_17,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_18,
                  in_stack_fffffffffffff874);
  w0_18[1] = in_stack_fffffffffffff8e0;
  w0_18[0] = in_stack_fffffffffffff8d8;
  w0_18[2] = in_stack_fffffffffffff8e8;
  w0_18[3] = in_stack_fffffffffffff8f0;
  w1_18[1] = in_stack_fffffffffffff8c0;
  w1_18[0] = in_stack_fffffffffffff8b8;
  w1_18[2] = in_stack_fffffffffffff8c8;
  w1_18[3] = in_stack_fffffffffffff8d0;
  _r_19[1] = in_stack_fffffffffffff880;
  _r_19[0] = in_stack_fffffffffffff878;
  _r_19[2] = in_stack_fffffffffffff888;
  _r_19[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_18,w1_18,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_19,
                  in_stack_fffffffffffff874);
  w0_19[1] = in_stack_fffffffffffff8e0;
  w0_19[0] = in_stack_fffffffffffff8d8;
  w0_19[2] = in_stack_fffffffffffff8e8;
  w0_19[3] = in_stack_fffffffffffff8f0;
  w1_19[1] = in_stack_fffffffffffff8c0;
  w1_19[0] = in_stack_fffffffffffff8b8;
  w1_19[2] = in_stack_fffffffffffff8c8;
  w1_19[3] = in_stack_fffffffffffff8d0;
  _r_20[1] = in_stack_fffffffffffff880;
  _r_20[0] = in_stack_fffffffffffff878;
  _r_20[2] = in_stack_fffffffffffff888;
  _r_20[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_19,w1_19,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_20,
                  in_stack_fffffffffffff874);
  w0_20[1] = in_stack_fffffffffffff8e0;
  w0_20[0] = in_stack_fffffffffffff8d8;
  w0_20[2] = in_stack_fffffffffffff8e8;
  w0_20[3] = in_stack_fffffffffffff8f0;
  w1_20[1] = in_stack_fffffffffffff8c0;
  w1_20[0] = in_stack_fffffffffffff8b8;
  w1_20[2] = in_stack_fffffffffffff8c8;
  w1_20[3] = in_stack_fffffffffffff8d0;
  _r_21[1] = in_stack_fffffffffffff880;
  _r_21[0] = in_stack_fffffffffffff878;
  _r_21[2] = in_stack_fffffffffffff888;
  _r_21[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_20,w1_20,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_21,
                  in_stack_fffffffffffff874);
  w0_21[1] = in_stack_fffffffffffff8e0;
  w0_21[0] = in_stack_fffffffffffff8d8;
  w0_21[2] = in_stack_fffffffffffff8e8;
  w0_21[3] = in_stack_fffffffffffff8f0;
  w1_21[1] = in_stack_fffffffffffff8c0;
  w1_21[0] = in_stack_fffffffffffff8b8;
  w1_21[2] = in_stack_fffffffffffff8c8;
  w1_21[3] = in_stack_fffffffffffff8d0;
  _r_22[1] = in_stack_fffffffffffff880;
  _r_22[0] = in_stack_fffffffffffff878;
  _r_22[2] = in_stack_fffffffffffff888;
  _r_22[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_21,w1_21,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_22,
                  in_stack_fffffffffffff874);
  w0_22[1] = in_stack_fffffffffffff8e0;
  w0_22[0] = in_stack_fffffffffffff8d8;
  w0_22[2] = in_stack_fffffffffffff8e8;
  w0_22[3] = in_stack_fffffffffffff8f0;
  w1_22[1] = in_stack_fffffffffffff8c0;
  w1_22[0] = in_stack_fffffffffffff8b8;
  w1_22[2] = in_stack_fffffffffffff8c8;
  w1_22[3] = in_stack_fffffffffffff8d0;
  _r_23[1] = in_stack_fffffffffffff880;
  _r_23[0] = in_stack_fffffffffffff878;
  _r_23[2] = in_stack_fffffffffffff888;
  _r_23[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_22,w1_22,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_23,
                  in_stack_fffffffffffff874);
  w0_23[1] = in_stack_fffffffffffff8e0;
  w0_23[0] = in_stack_fffffffffffff8d8;
  w0_23[2] = in_stack_fffffffffffff8e8;
  w0_23[3] = in_stack_fffffffffffff8f0;
  w1_23[1] = in_stack_fffffffffffff8c0;
  w1_23[0] = in_stack_fffffffffffff8b8;
  w1_23[2] = in_stack_fffffffffffff8c8;
  w1_23[3] = in_stack_fffffffffffff8d0;
  _r_24[1] = in_stack_fffffffffffff880;
  _r_24[0] = in_stack_fffffffffffff878;
  _r_24[2] = in_stack_fffffffffffff888;
  _r_24[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_23,w1_23,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_24,
                  in_stack_fffffffffffff874);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  btf_16_adds_subs_avx2(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  w0_24[1] = in_stack_fffffffffffff8e0;
  w0_24[0] = in_stack_fffffffffffff8d8;
  w0_24[2] = in_stack_fffffffffffff8e8;
  w0_24[3] = in_stack_fffffffffffff8f0;
  w1_24[1] = in_stack_fffffffffffff8c0;
  w1_24[0] = in_stack_fffffffffffff8b8;
  w1_24[2] = in_stack_fffffffffffff8c8;
  w1_24[3] = in_stack_fffffffffffff8d0;
  _r_25[1] = in_stack_fffffffffffff880;
  _r_25[0] = in_stack_fffffffffffff878;
  _r_25[2] = in_stack_fffffffffffff888;
  _r_25[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_24,w1_24,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_25,
                  in_stack_fffffffffffff874);
  w0_25[1] = in_stack_fffffffffffff8e0;
  w0_25[0] = in_stack_fffffffffffff8d8;
  w0_25[2] = in_stack_fffffffffffff8e8;
  w0_25[3] = in_stack_fffffffffffff8f0;
  w1_25[1] = in_stack_fffffffffffff8c0;
  w1_25[0] = in_stack_fffffffffffff8b8;
  w1_25[2] = in_stack_fffffffffffff8c8;
  w1_25[3] = in_stack_fffffffffffff8d0;
  _r_26[1] = in_stack_fffffffffffff880;
  _r_26[0] = in_stack_fffffffffffff878;
  _r_26[2] = in_stack_fffffffffffff888;
  _r_26[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_25,w1_25,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_26,
                  in_stack_fffffffffffff874);
  w0_26[1] = in_stack_fffffffffffff8e0;
  w0_26[0] = in_stack_fffffffffffff8d8;
  w0_26[2] = in_stack_fffffffffffff8e8;
  w0_26[3] = in_stack_fffffffffffff8f0;
  w1_26[1] = in_stack_fffffffffffff8c0;
  w1_26[0] = in_stack_fffffffffffff8b8;
  w1_26[2] = in_stack_fffffffffffff8c8;
  w1_26[3] = in_stack_fffffffffffff8d0;
  _r_27[1] = in_stack_fffffffffffff880;
  _r_27[0] = in_stack_fffffffffffff878;
  _r_27[2] = in_stack_fffffffffffff888;
  _r_27[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_26,w1_26,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_27,
                  in_stack_fffffffffffff874);
  w0_27[1] = in_stack_fffffffffffff8e0;
  w0_27[0] = in_stack_fffffffffffff8d8;
  w0_27[2] = in_stack_fffffffffffff8e8;
  w0_27[3] = in_stack_fffffffffffff8f0;
  w1_27[1] = in_stack_fffffffffffff8c0;
  w1_27[0] = in_stack_fffffffffffff8b8;
  w1_27[2] = in_stack_fffffffffffff8c8;
  w1_27[3] = in_stack_fffffffffffff8d0;
  _r_28[1] = in_stack_fffffffffffff880;
  _r_28[0] = in_stack_fffffffffffff878;
  _r_28[2] = in_stack_fffffffffffff888;
  _r_28[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_27,w1_27,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_28,
                  in_stack_fffffffffffff874);
  w0_28[1] = in_stack_fffffffffffff8e0;
  w0_28[0] = in_stack_fffffffffffff8d8;
  w0_28[2] = in_stack_fffffffffffff8e8;
  w0_28[3] = in_stack_fffffffffffff8f0;
  w1_28[1] = in_stack_fffffffffffff8c0;
  w1_28[0] = in_stack_fffffffffffff8b8;
  w1_28[2] = in_stack_fffffffffffff8c8;
  w1_28[3] = in_stack_fffffffffffff8d0;
  _r_29[1] = in_stack_fffffffffffff880;
  _r_29[0] = in_stack_fffffffffffff878;
  _r_29[2] = in_stack_fffffffffffff888;
  _r_29[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_28,w1_28,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_29,
                  in_stack_fffffffffffff874);
  w0_29[1] = in_stack_fffffffffffff8e0;
  w0_29[0] = in_stack_fffffffffffff8d8;
  w0_29[2] = in_stack_fffffffffffff8e8;
  w0_29[3] = in_stack_fffffffffffff8f0;
  w1_29[1] = in_stack_fffffffffffff8c0;
  w1_29[0] = in_stack_fffffffffffff8b8;
  w1_29[2] = in_stack_fffffffffffff8c8;
  w1_29[3] = in_stack_fffffffffffff8d0;
  _r_30[1] = in_stack_fffffffffffff880;
  _r_30[0] = in_stack_fffffffffffff878;
  _r_30[2] = in_stack_fffffffffffff888;
  _r_30[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_29,w1_29,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_30,
                  in_stack_fffffffffffff874);
  w0_30[1] = in_stack_fffffffffffff8e0;
  w0_30[0] = in_stack_fffffffffffff8d8;
  w0_30[2] = in_stack_fffffffffffff8e8;
  w0_30[3] = in_stack_fffffffffffff8f0;
  w1_30[1] = in_stack_fffffffffffff8c0;
  w1_30[0] = in_stack_fffffffffffff8b8;
  w1_30[2] = in_stack_fffffffffffff8c8;
  w1_30[3] = in_stack_fffffffffffff8d0;
  _r_31[1] = in_stack_fffffffffffff880;
  _r_31[0] = in_stack_fffffffffffff878;
  _r_31[2] = in_stack_fffffffffffff888;
  _r_31[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_30,w1_30,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_31,
                  in_stack_fffffffffffff874);
  w0_31[1] = in_stack_fffffffffffff8e0;
  w0_31[0] = in_stack_fffffffffffff8d8;
  w0_31[2] = in_stack_fffffffffffff8e8;
  w0_31[3] = in_stack_fffffffffffff8f0;
  w1_31[1] = in_stack_fffffffffffff8c0;
  w1_31[0] = in_stack_fffffffffffff8b8;
  w1_31[2] = in_stack_fffffffffffff8c8;
  w1_31[3] = in_stack_fffffffffffff8d0;
  _r_32[1] = in_stack_fffffffffffff880;
  _r_32[0] = in_stack_fffffffffffff878;
  _r_32[2] = in_stack_fffffffffffff888;
  _r_32[3] = in_stack_fffffffffffff890;
  btf_16_w16_avx2(w0_31,w1_31,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,_r_32,
                  in_stack_fffffffffffff874);
  *in_RSI = local_960;
  in_RSI[1] = uStackY_958;
  in_RSI[2] = CONCAT44(uStack_94c,CONCAT22(in_stack_fffffffffffff6b2,in_stack_fffffffffffff6b0));
  in_RSI[3] = uStack_948;
  in_RSI[4] = local_760;
  in_RSI[5] = in_stack_fffffffffffff8a8;
  in_RSI[6] = in_stack_fffffffffffff8b0;
  in_RSI[7] = in_stack_fffffffffffff8b8;
  in_RSI[8] = local_860;
  in_RSI[9] = uStack_858;
  in_RSI[10] = uStack_850;
  in_RSI[0xb] = uStack_848;
  in_RSI[0xc] = local_660;
  in_RSI[0xd] = uStack_658;
  in_RSI[0xe] = uStack_650;
  in_RSI[0xf] = uStack_648;
  in_RSI[0x10] = local_8e0;
  in_RSI[0x11] = in_stack_fffffffffffff728;
  in_RSI[0x12] = in_stack_fffffffffffff730;
  in_RSI[0x13] = uStack_8c8;
  in_RSI[0x14] = local_6e0;
  in_RSI[0x15] = uStack_6d8;
  in_RSI[0x16] = uStack_6d0;
  in_RSI[0x17] = uStack_6c8;
  in_RSI[0x18] = local_7e0;
  in_RSI[0x19] = uStack_7d8;
  in_RSI[0x1a] = uStack_7d0;
  in_RSI[0x1b] = uStack_7c8;
  in_RSI[0x1c] = local_5e0;
  in_RSI[0x1d] = uStack_5d8;
  in_RSI[0x1e] = uStack_5d0;
  in_RSI[0x1f] = uStack_5c8;
  in_RSI[0x20] = in_stack_fffffffffffff6e0;
  in_RSI[0x21] = in_stack_fffffffffffff6e8;
  in_RSI[0x22] = in_stack_fffffffffffff6f0;
  in_RSI[0x23] = in_stack_fffffffffffff6f8;
  in_RSI[0x24] = in_stack_fffffffffffff8e0;
  in_RSI[0x25] = in_stack_fffffffffffff8e8;
  in_RSI[0x26] = in_stack_fffffffffffff8f0;
  in_RSI[0x27] = uStack_708;
  in_RSI[0x28] = local_820;
  in_RSI[0x29] = uStack_818;
  in_RSI[0x2a] = uStack_810;
  in_RSI[0x2b] = uStack_808;
  in_RSI[0x2c] = local_620;
  in_RSI[0x2d] = uStack_618;
  in_RSI[0x2e] = uStack_610;
  in_RSI[0x2f] = uStack_608;
  in_RSI[0x30] = local_8a0;
  in_RSI[0x31] = uStack_898;
  in_RSI[0x32] = uStack_890;
  in_RSI[0x33] = uStack_888;
  in_RSI[0x34] = local_6a0;
  in_RSI[0x35] = uStack_698;
  in_RSI[0x36] = uStack_690;
  in_RSI[0x37] = uStack_688;
  in_RSI[0x38] = local_7a0;
  in_RSI[0x39] = uStack_798;
  in_RSI[0x3a] = CONCAT44(in_stack_fffffffffffff874,uStack_790);
  in_RSI[0x3b] = in_stack_fffffffffffff878;
  in_RSI[0x3c] = local_5a0;
  in_RSI[0x3d] = uStack_598;
  in_RSI[0x3e] = uStack_590;
  in_RSI[0x3f] = uStack_588;
  in_RSI[0x40] = local_940;
  in_RSI[0x41] = uStack_938;
  in_RSI[0x42] = uStack_930;
  in_RSI[0x43] = in_stack_fffffffffffff6d8;
  in_RSI[0x44] = in_stack_fffffffffffff8c0;
  in_RSI[0x45] = in_stack_fffffffffffff8c8;
  in_RSI[0x46] = in_stack_fffffffffffff8d0;
  in_RSI[0x47] = in_stack_fffffffffffff8d8;
  in_RSI[0x48] = local_840;
  in_RSI[0x49] = uStack_838;
  in_RSI[0x4a] = uStack_830;
  in_RSI[0x4b] = uStack_828;
  in_RSI[0x4c] = local_640;
  in_RSI[0x4d] = uStack_638;
  in_RSI[0x4e] = uStack_630;
  in_RSI[0x4f] = uStack_628;
  in_RSI[0x50] = local_8c0;
  in_RSI[0x51] = uStack_8b8;
  in_RSI[0x52] = uStack_8b0;
  in_RSI[0x53] = uStack_8a8;
  in_RSI[0x54] = local_6c0;
  in_RSI[0x55] = uStack_6b8;
  in_RSI[0x56] = uStack_6b0;
  in_RSI[0x57] = uStack_6a8;
  in_RSI[0x58] = local_7c0;
  in_RSI[0x59] = uStack_7b8;
  in_RSI[0x5a] = uStack_7b0;
  in_RSI[0x5b] = uStack_7a8;
  in_RSI[0x5c] = local_5c0;
  in_RSI[0x5d] = uStack_5b8;
  in_RSI[0x5e] = uStack_5b0;
  in_RSI[0x5f] = uStack_5a8;
  in_RSI[0x60] = in_stack_fffffffffffff700;
  in_RSI[0x61] = in_stack_fffffffffffff708;
  in_RSI[0x62] = in_stack_fffffffffffff710;
  in_RSI[99] = uStack_8e8;
  in_RSI[100] = local_700;
  in_RSI[0x65] = uStack_6f8;
  in_RSI[0x66] = uStack_6f0;
  in_RSI[0x67] = uStack_6e8;
  in_RSI[0x68] = local_800;
  in_RSI[0x69] = uStack_7f8;
  in_RSI[0x6a] = uStack_7f0;
  in_RSI[0x6b] = uStack_7e8;
  in_RSI[0x6c] = local_600;
  in_RSI[0x6d] = uStack_5f8;
  in_RSI[0x6e] = uStack_5f0;
  in_RSI[0x6f] = uStack_5e8;
  in_RSI[0x70] = local_880;
  in_RSI[0x71] = uStack_878;
  in_RSI[0x72] = uStack_870;
  in_RSI[0x73] = uStack_868;
  in_RSI[0x74] = local_680;
  in_RSI[0x75] = uStack_678;
  in_RSI[0x76] = uStack_670;
  in_RSI[0x77] = uStack_668;
  in_RSI[0x78] = in_stack_fffffffffffff880;
  in_RSI[0x79] = in_stack_fffffffffffff888;
  in_RSI[0x7a] = in_stack_fffffffffffff890;
  in_RSI[0x7b] = uStack_768;
  in_RSI[0x7c] = local_580;
  in_RSI[0x7d] = uStack_578;
  in_RSI[0x7e] = uStack_570;
  in_RSI[0x7f] = uStack_568;
  return;
}

Assistant:

static inline void fdct16x32_avx2(const __m256i *input, __m256i *output,
                                  int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i _r = _mm256_set1_epi32(1 << (cos_bit - 1));

  __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p56_p08 = pair_set_w16_epi16(cospi[56], cospi[8]);
  __m256i cospi_m08_p56 = pair_set_w16_epi16(-cospi[8], cospi[56]);
  __m256i cospi_p24_p40 = pair_set_w16_epi16(cospi[24], cospi[40]);
  __m256i cospi_m40_p24 = pair_set_w16_epi16(-cospi[40], cospi[24]);
  __m256i cospi_m56_m08 = pair_set_w16_epi16(-cospi[56], -cospi[8]);
  __m256i cospi_m24_m40 = pair_set_w16_epi16(-cospi[24], -cospi[40]);
  __m256i cospi_p60_p04 = pair_set_w16_epi16(cospi[60], cospi[4]);
  __m256i cospi_m04_p60 = pair_set_w16_epi16(-cospi[4], cospi[60]);
  __m256i cospi_p28_p36 = pair_set_w16_epi16(cospi[28], cospi[36]);
  __m256i cospi_m36_p28 = pair_set_w16_epi16(-cospi[36], cospi[28]);
  __m256i cospi_p44_p20 = pair_set_w16_epi16(cospi[44], cospi[20]);
  __m256i cospi_m20_p44 = pair_set_w16_epi16(-cospi[20], cospi[44]);
  __m256i cospi_p12_p52 = pair_set_w16_epi16(cospi[12], cospi[52]);
  __m256i cospi_m52_p12 = pair_set_w16_epi16(-cospi[52], cospi[12]);
  __m256i cospi_p62_p02 = pair_set_w16_epi16(cospi[62], cospi[2]);
  __m256i cospi_m02_p62 = pair_set_w16_epi16(-cospi[2], cospi[62]);
  __m256i cospi_p30_p34 = pair_set_w16_epi16(cospi[30], cospi[34]);
  __m256i cospi_m34_p30 = pair_set_w16_epi16(-cospi[34], cospi[30]);
  __m256i cospi_p46_p18 = pair_set_w16_epi16(cospi[46], cospi[18]);
  __m256i cospi_m18_p46 = pair_set_w16_epi16(-cospi[18], cospi[46]);
  __m256i cospi_p14_p50 = pair_set_w16_epi16(cospi[14], cospi[50]);
  __m256i cospi_m50_p14 = pair_set_w16_epi16(-cospi[50], cospi[14]);
  __m256i cospi_p54_p10 = pair_set_w16_epi16(cospi[54], cospi[10]);
  __m256i cospi_m10_p54 = pair_set_w16_epi16(-cospi[10], cospi[54]);
  __m256i cospi_p22_p42 = pair_set_w16_epi16(cospi[22], cospi[42]);
  __m256i cospi_m42_p22 = pair_set_w16_epi16(-cospi[42], cospi[22]);
  __m256i cospi_p38_p26 = pair_set_w16_epi16(cospi[38], cospi[26]);
  __m256i cospi_m26_p38 = pair_set_w16_epi16(-cospi[26], cospi[38]);
  __m256i cospi_p06_p58 = pair_set_w16_epi16(cospi[6], cospi[58]);
  __m256i cospi_m58_p06 = pair_set_w16_epi16(-cospi[58], cospi[6]);

  // stage 1
  __m256i x1[32];
  btf_16_adds_subs_out_avx2(&x1[0], &x1[31], input[0], input[31]);
  btf_16_adds_subs_out_avx2(&x1[1], &x1[30], input[1], input[30]);
  btf_16_adds_subs_out_avx2(&x1[2], &x1[29], input[2], input[29]);
  btf_16_adds_subs_out_avx2(&x1[3], &x1[28], input[3], input[28]);
  btf_16_adds_subs_out_avx2(&x1[4], &x1[27], input[4], input[27]);
  btf_16_adds_subs_out_avx2(&x1[5], &x1[26], input[5], input[26]);
  btf_16_adds_subs_out_avx2(&x1[6], &x1[25], input[6], input[25]);
  btf_16_adds_subs_out_avx2(&x1[7], &x1[24], input[7], input[24]);
  btf_16_adds_subs_out_avx2(&x1[8], &x1[23], input[8], input[23]);
  btf_16_adds_subs_out_avx2(&x1[9], &x1[22], input[9], input[22]);
  btf_16_adds_subs_out_avx2(&x1[10], &x1[21], input[10], input[21]);
  btf_16_adds_subs_out_avx2(&x1[11], &x1[20], input[11], input[20]);
  btf_16_adds_subs_out_avx2(&x1[12], &x1[19], input[12], input[19]);
  btf_16_adds_subs_out_avx2(&x1[13], &x1[18], input[13], input[18]);
  btf_16_adds_subs_out_avx2(&x1[14], &x1[17], input[14], input[17]);
  btf_16_adds_subs_out_avx2(&x1[15], &x1[16], input[15], input[16]);

  // stage 2
  btf_16_adds_subs_avx2(&x1[0], &x1[15]);
  btf_16_adds_subs_avx2(&x1[1], &x1[14]);
  btf_16_adds_subs_avx2(&x1[2], &x1[13]);
  btf_16_adds_subs_avx2(&x1[3], &x1[12]);
  btf_16_adds_subs_avx2(&x1[4], &x1[11]);
  btf_16_adds_subs_avx2(&x1[5], &x1[10]);
  btf_16_adds_subs_avx2(&x1[6], &x1[9]);
  btf_16_adds_subs_avx2(&x1[7], &x1[8]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[20], &x1[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[21], &x1[26], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[22], &x1[25], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[23], &x1[24], _r, cos_bit);

  // stage 3
  btf_16_adds_subs_avx2(&x1[0], &x1[7]);
  btf_16_adds_subs_avx2(&x1[1], &x1[6]);
  btf_16_adds_subs_avx2(&x1[2], &x1[5]);
  btf_16_adds_subs_avx2(&x1[3], &x1[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[10], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[11], &x1[12], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[16], &x1[23]);
  btf_16_adds_subs_avx2(&x1[17], &x1[22]);
  btf_16_adds_subs_avx2(&x1[18], &x1[21]);
  btf_16_adds_subs_avx2(&x1[19], &x1[20]);
  btf_16_adds_subs_avx2(&x1[31], &x1[24]);
  btf_16_adds_subs_avx2(&x1[30], &x1[25]);
  btf_16_adds_subs_avx2(&x1[29], &x1[26]);
  btf_16_adds_subs_avx2(&x1[28], &x1[27]);

  // stage 4
  btf_16_adds_subs_avx2(&x1[0], &x1[3]);
  btf_16_adds_subs_avx2(&x1[1], &x1[2]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[5], &x1[6], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[8], &x1[11]);
  btf_16_adds_subs_avx2(&x1[9], &x1[10]);
  btf_16_adds_subs_avx2(&x1[15], &x1[12]);
  btf_16_adds_subs_avx2(&x1[14], &x1[13]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[18], &x1[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[19], &x1[28], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[20], &x1[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[21], &x1[26], _r, cos_bit);

  // stage 5
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[0], &x1[1], _r, cos_bit);
  btf_16_w16_avx2(cospi_p48_p16, cospi_m16_p48, &x1[2], &x1[3], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[4], &x1[5]);
  btf_16_adds_subs_avx2(&x1[7], &x1[6]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[9], &x1[14], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[10], &x1[13], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[16], &x1[19]);
  btf_16_adds_subs_avx2(&x1[17], &x1[18]);
  btf_16_adds_subs_avx2(&x1[23], &x1[20]);
  btf_16_adds_subs_avx2(&x1[22], &x1[21]);
  btf_16_adds_subs_avx2(&x1[24], &x1[27]);
  btf_16_adds_subs_avx2(&x1[25], &x1[26]);
  btf_16_adds_subs_avx2(&x1[31], &x1[28]);
  btf_16_adds_subs_avx2(&x1[30], &x1[29]);

  // stage 6
  btf_16_w16_avx2(cospi_p56_p08, cospi_m08_p56, &x1[4], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p24_p40, cospi_m40_p24, &x1[5], &x1[6], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[8], &x1[9]);
  btf_16_adds_subs_avx2(&x1[11], &x1[10]);
  btf_16_adds_subs_avx2(&x1[12], &x1[13]);
  btf_16_adds_subs_avx2(&x1[15], &x1[14]);
  btf_16_w16_avx2(cospi_m08_p56, cospi_p56_p08, &x1[17], &x1[30], _r, cos_bit);
  btf_16_w16_avx2(cospi_m56_m08, cospi_m08_p56, &x1[18], &x1[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_m40_p24, cospi_p24_p40, &x1[21], &x1[26], _r, cos_bit);
  btf_16_w16_avx2(cospi_m24_m40, cospi_m40_p24, &x1[22], &x1[25], _r, cos_bit);

  // stage 7
  btf_16_w16_avx2(cospi_p60_p04, cospi_m04_p60, &x1[8], &x1[15], _r, cos_bit);
  btf_16_w16_avx2(cospi_p28_p36, cospi_m36_p28, &x1[9], &x1[14], _r, cos_bit);
  btf_16_w16_avx2(cospi_p44_p20, cospi_m20_p44, &x1[10], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_p12_p52, cospi_m52_p12, &x1[11], &x1[12], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[16], &x1[17]);
  btf_16_adds_subs_avx2(&x1[19], &x1[18]);
  btf_16_adds_subs_avx2(&x1[20], &x1[21]);
  btf_16_adds_subs_avx2(&x1[23], &x1[22]);
  btf_16_adds_subs_avx2(&x1[24], &x1[25]);
  btf_16_adds_subs_avx2(&x1[27], &x1[26]);
  btf_16_adds_subs_avx2(&x1[28], &x1[29]);
  btf_16_adds_subs_avx2(&x1[31], &x1[30]);

  // stage 8
  btf_16_w16_avx2(cospi_p62_p02, cospi_m02_p62, &x1[16], &x1[31], _r, cos_bit);
  btf_16_w16_avx2(cospi_p30_p34, cospi_m34_p30, &x1[17], &x1[30], _r, cos_bit);
  btf_16_w16_avx2(cospi_p46_p18, cospi_m18_p46, &x1[18], &x1[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_p14_p50, cospi_m50_p14, &x1[19], &x1[28], _r, cos_bit);
  btf_16_w16_avx2(cospi_p54_p10, cospi_m10_p54, &x1[20], &x1[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_p22_p42, cospi_m42_p22, &x1[21], &x1[26], _r, cos_bit);
  btf_16_w16_avx2(cospi_p38_p26, cospi_m26_p38, &x1[22], &x1[25], _r, cos_bit);
  btf_16_w16_avx2(cospi_p06_p58, cospi_m58_p06, &x1[23], &x1[24], _r, cos_bit);

  // stage 9
  output[0] = x1[0];
  output[1] = x1[16];
  output[2] = x1[8];
  output[3] = x1[24];
  output[4] = x1[4];
  output[5] = x1[20];
  output[6] = x1[12];
  output[7] = x1[28];
  output[8] = x1[2];
  output[9] = x1[18];
  output[10] = x1[10];
  output[11] = x1[26];
  output[12] = x1[6];
  output[13] = x1[22];
  output[14] = x1[14];
  output[15] = x1[30];
  output[16] = x1[1];
  output[17] = x1[17];
  output[18] = x1[9];
  output[19] = x1[25];
  output[20] = x1[5];
  output[21] = x1[21];
  output[22] = x1[13];
  output[23] = x1[29];
  output[24] = x1[3];
  output[25] = x1[19];
  output[26] = x1[11];
  output[27] = x1[27];
  output[28] = x1[7];
  output[29] = x1[23];
  output[30] = x1[15];
  output[31] = x1[31];
}